

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

Guid __thiscall Jinx::Variant::GetGuid(Variant *this)

{
  bool bVar1;
  Guid GVar2;
  undefined1 local_48 [8];
  Variant v;
  Variant *this_local;
  
  v.field_1._24_8_ = this;
  bVar1 = IsGuid(this);
  if (bVar1) {
    GVar2 = (this->field_1).m_guid;
  }
  else {
    Variant((Variant *)local_48,this);
    bVar1 = ConvertTo((Variant *)local_48,Guid);
    if (bVar1) {
      GVar2 = GetGuid((Variant *)local_48);
    }
    else {
      GVar2 = (Guid)ZEXT816(0);
    }
    ~Variant((Variant *)local_48);
  }
  return GVar2;
}

Assistant:

inline_t Guid Variant::GetGuid() const
	{
		if (IsGuid())
			return m_guid;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Guid))
			return NullGuid;
		return v.GetGuid();
	}